

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSessionTests::initiatorFixtureResendRequest_EndSeqNumberLargerThanMessagesHelper::
~initiatorFixtureResendRequest_EndSeqNumberLargerThanMessagesHelper
          (initiatorFixtureResendRequest_EndSeqNumberLargerThanMessagesHelper *this)

{
  sessionFixture::~sessionFixture((sessionFixture *)&this[-1].m_details);
  operator_delete(&this[-1].m_details,0x630);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, ResendRequest_EndSeqNumberLargerThanMessages) {
  startLoggedOn();

  object->setNextSenderMsgSeqNum(15);

  FIX::Message resendReq = createResendRequest( "ISLD", "TW", 2, 1, 20);
  object->next(resendReq, UtcTimeStamp());

  CHECK_EQUAL(15, object->getExpectedSenderNum());
  CHECK_EQUAL(3, object->getExpectedTargetNum());
}